

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::Signal<double,_int>::setReferenceNonConstant
          (Signal<double,_int> *this,double *t,Mutex *mutexref)

{
  Mutex *mutexref_local;
  double *t_local;
  Signal<double,_int> *this_local;
  
  this->signalType = REFERENCE_NON_CONST;
  this->Treference = t;
  this->TreferenceNonConst = t;
  this->providerMutex = mutexref;
  this->copyInit = false;
  SignalBase<int>::setReady(&this->super_SignalBase<int>,true);
  return;
}

Assistant:

void Signal<T, Time>::setReferenceNonConstant(T *t, Mutex *mutexref) {
  signalType = REFERENCE_NON_CONST;
  Treference = t;
  TreferenceNonConst = t;
  providerMutex = mutexref;
  copyInit = false;
  setReady();
}